

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::post_status(torrent *this,status_flags_t flags)

{
  int iVar1;
  reference st;
  undefined4 extraout_var;
  undefined1 local_30 [8];
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> s;
  torrent *this_local;
  status_flags_t flags_local;
  
  s.super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::vector
            ((vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *)
             local_30);
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::resize
            ((vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *)
             local_30,1);
  st = ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::front
                 ((vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *
                  )local_30);
  status(this,st,flags);
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  alert_manager::
  emplace_alert<libtorrent::state_update_alert,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>>
            ((alert_manager *)CONCAT44(extraout_var,iVar1),
             (vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *)
             local_30);
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::~vector
            ((vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *)
             local_30);
  return;
}

Assistant:

void torrent::post_status(status_flags_t const flags)
	{
		std::vector<torrent_status> s;
		s.resize(1);
		status(&s.front(), flags);
		m_ses.alerts().emplace_alert<state_update_alert>(std::move(s));
	}